

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

bool testing::internal::BoolFromGTestEnv(char *flag,bool default_value)

{
  int iVar1;
  char *pcVar2;
  char *in_RDX;
  byte local_61;
  char *string_value;
  string env_var;
  bool default_value_local;
  char *flag_local;
  
  env_var.field_2._M_local_buf[0xf] = default_value;
  FlagToEnvVar_abi_cxx11_((string *)&string_value,(internal *)flag,in_RDX);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar2 = posix::GetEnv(pcVar2);
  if (pcVar2 == (char *)0x0) {
    local_61 = env_var.field_2._M_local_buf[0xf];
  }
  else {
    iVar1 = strcmp(pcVar2,"0");
    local_61 = iVar1 != 0;
  }
  std::__cxx11::string::~string((string *)&string_value);
  return (bool)(local_61 & 1);
}

Assistant:

bool BoolFromGTestEnv(const char* flag, bool default_value) {
#if defined(GTEST_GET_BOOL_FROM_ENV_)
  return GTEST_GET_BOOL_FROM_ENV_(flag, default_value);
#else
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  return string_value == NULL ?
      default_value : strcmp(string_value, "0") != 0;
#endif  // defined(GTEST_GET_BOOL_FROM_ENV_)
}